

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgensubstruct.cpp
# Opt level: O2

void InitializeMatrices(TPZSubCompMesh *submesh,TPZAutoPointer<TPZDohrSubstruct<double>_> *substruct
                       ,TPZDohrAssembly<double> *dohrassembly)

{
  TPZDohrSubstruct<double> *pTVar1;
  long lVar2;
  int iVar3;
  TPZGuiInterface *this;
  TPZBaseMatrix *pTVar4;
  TPZMatrix<double> *pTVar5;
  undefined4 extraout_var;
  TPZAutoPointer<TPZGuiInterface> toto;
  TPZAutoPointer<TPZBaseMatrix> local_238;
  TPZAutoPointer<TPZBaseMatrix> local_230;
  TPZAutoPointer<TPZGuiInterface> local_228;
  TPZAutoPointer<TPZGuiInterface> local_220;
  TPZFMatrix<double> rhs;
  TPZManVector<long,_10> invpermute;
  TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_> skylstr;
  
  TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>::TPZStructMatrix
            (&skylstr,&submesh->super_TPZCompMesh);
  this = (TPZGuiInterface *)operator_new(0x40);
  TPZGuiInterface::TPZGuiInterface(this);
  TPZAutoPointer<TPZGuiInterface>::TPZAutoPointer(&toto,this);
  TPZEquationFilter::Reset
            (&skylstr.super_TPZStructMatrixT<double>.super_TPZStructMatrix.fEquationFilter);
  pTVar1 = substruct->fRef->fPointer;
  lVar2 = *(long *)(skylstr.super_TPZStructMatrixT<double>.super_TPZStructMatrix._0_8_ + -0x60);
  local_220.fRef = toto.fRef;
  LOCK();
  ((toto.fRef)->fCounter).super___atomic_base<int>._M_i =
       ((toto.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  pTVar4 = TPZStrMatParInterface::CreateAssemble
                     ((TPZStrMatParInterface *)
                      (&skylstr.super_TPZStructMatrixT<double>.super_TPZStructMatrix.field_0x0 +
                      lVar2),(TPZBaseMatrix *)&pTVar1->fLocalLoad,&local_220);
  if (pTVar4 == (TPZBaseMatrix *)0x0) {
    pTVar5 = (TPZMatrix<double> *)0x0;
  }
  else {
    pTVar5 = (TPZMatrix<double> *)
             __dynamic_cast(pTVar4,&TPZBaseMatrix::typeinfo,&TPZMatrix<double>::typeinfo,0);
  }
  TPZAutoPointer<TPZMatrix<double>_>::TPZAutoPointer
            ((TPZAutoPointer<TPZMatrix<double>_> *)&rhs,pTVar5);
  TPZAutoPointer<TPZMatrix<double>_>::operator=
            (&substruct->fRef->fPointer->fStiffness,(TPZAutoPointer<TPZMatrix<double>_> *)&rhs);
  TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer((TPZAutoPointer<TPZMatrix<double>_> *)&rhs);
  TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer(&local_220);
  pTVar1 = substruct->fRef->fPointer;
  iVar3 = (*(((pTVar1->fStiffness).fRef)->fPointer->super_TPZBaseMatrix).super_TPZSavable.
            _vptr_TPZSavable[0x1e])();
  TPZAutoPointer<TPZBaseMatrix>::TPZAutoPointer<TPZMatrix<double>>
            (&local_230,(TPZMatrix<double> *)CONCAT44(extraout_var,iVar3));
  TPZMatrixSolver<double>::SetMatrix
            (&(pTVar1->fInvertedStiffness).super_TPZMatrixSolver<double>,&local_230);
  TPZAutoPointer<TPZBaseMatrix>::~TPZAutoPointer(&local_230);
  TPZStepSolver<double>::SetDirect(&substruct->fRef->fPointer->fInvertedStiffness,ECholesky);
  TPZManVector<long,_10>::TPZManVector(&invpermute,0);
  TPZGenSubStruct::ReorderInternalNodes2
            (submesh,&substruct->fRef->fPointer->fInternalEqs,&invpermute.super_TPZVec<long>);
  TPZStructMatrix::SetEquationRange
            ((TPZStructMatrix *)&skylstr,0,(substruct->fRef->fPointer->fInternalEqs).fNElements);
  TPZFMatrix<double>::TPZFMatrix(&rhs);
  pTVar1 = substruct->fRef->fPointer;
  lVar2 = *(long *)(skylstr.super_TPZStructMatrixT<double>.super_TPZStructMatrix._0_8_ + -0x60);
  local_228.fRef = toto.fRef;
  LOCK();
  ((toto.fRef)->fCounter).super___atomic_base<int>._M_i =
       ((toto.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  pTVar4 = TPZStrMatParInterface::CreateAssemble
                     ((TPZStrMatParInterface *)
                      (&skylstr.super_TPZStructMatrixT<double>.super_TPZStructMatrix.field_0x0 +
                      lVar2),(TPZBaseMatrix *)&rhs,&local_228);
  if (pTVar4 == (TPZBaseMatrix *)0x0) {
    pTVar5 = (TPZMatrix<double> *)0x0;
  }
  else {
    pTVar5 = (TPZMatrix<double> *)
             __dynamic_cast(pTVar4,&TPZBaseMatrix::typeinfo,&TPZMatrix<double>::typeinfo,0);
  }
  TPZAutoPointer<TPZBaseMatrix>::TPZAutoPointer<TPZMatrix<double>>(&local_238,pTVar5);
  TPZMatrixSolver<double>::SetMatrix
            (&(pTVar1->fInvertedInternalStiffness).super_TPZMatrixSolver<double>,&local_238);
  TPZAutoPointer<TPZBaseMatrix>::~TPZAutoPointer(&local_238);
  TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer(&local_228);
  TPZStepSolver<double>::SetDirect(&substruct->fRef->fPointer->fInvertedInternalStiffness,ECholesky)
  ;
  TPZCompMesh::Permute(&submesh->super_TPZCompMesh,&invpermute.super_TPZVec<long>);
  TPZFMatrix<double>::~TPZFMatrix(&rhs);
  TPZManVector<long,_10>::~TPZManVector(&invpermute);
  TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer(&toto);
  TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>::~TPZSkylineStructMatrix(&skylstr);
  return;
}

Assistant:

void InitializeMatrices(TPZSubCompMesh *submesh, TPZAutoPointer<TPZDohrSubstruct<STATE> > substruct, TPZDohrAssembly<STATE> &dohrassembly)
{
	// this should happen in the remote processor
    TPZSkylineStructMatrix<STATE> skylstr(submesh);
	TPZAutoPointer<TPZGuiInterface> toto = new TPZGuiInterface;

	skylstr.EquationFilter().Reset();
    substruct->fStiffness = TPZAutoPointer<TPZMatrix<STATE> > (
		dynamic_cast<TPZMatrix<STATE>*>(skylstr.CreateAssemble(substruct->fLocalLoad,toto)));
	
	// This should happen in the remote processor
    substruct->fInvertedStiffness.SetMatrix(substruct->fStiffness->Clone());
    substruct->fInvertedStiffness.SetDirect(ECholesky);
	
	TPZManVector<int64_t> invpermute;
	TPZGenSubStruct::ReorderInternalNodes2(submesh,substruct->fInternalEqs,invpermute);
	// compute the stiffness matrix associated with the internal nodes
	// fInternalEqs indicates the permutation of the global equations to the numbering of the internal equations
	// this is meaningless if the internal nodes are invisible to the global structure
    int64_t ninternal = substruct->fInternalEqs.NElements();
	// THIS SHOULD HAPPEN IN THE REMOTE PROCESSOR
    skylstr.SetEquationRange(0,ninternal);
    TPZFMatrix<STATE> rhs;
    substruct->fInvertedInternalStiffness.SetMatrix(
		dynamic_cast<TPZMatrix<STATE>*>(skylstr.CreateAssemble(rhs,toto)));
    substruct->fInvertedInternalStiffness.SetDirect(ECholesky);
	
    // put back the original sequence numbers of the connects (otherwise we can't apply a load solution
    
	submesh->Permute(invpermute);
	
}